

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fucomi_ST0_FT0_x86_64(CPUX86State *env)

{
  undefined8 uVar1;
  undefined2 uVar2;
  int iVar3;
  uint32_t uVar4;
  floatx80 a;
  floatx80 b;
  int ret;
  int eflags;
  CPUX86State *env_local;
  
  uVar1 = (env->ft0).low;
  uVar2 = (env->ft0).high;
  b.high = uVar2;
  b.low = uVar1;
  a._10_6_ = 0;
  a._0_10_ = *(unkuint10 *)(env->fpregs + env->fpstt);
  b._10_6_ = 0;
  iVar3 = floatx80_compare_quiet_x86_64(a,b,&env->fp_status);
  uVar4 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  env->cc_src = (long)(int)(uVar4 & 0xffffffba | fcomi_ccval[iVar3 + 1]);
  return;
}

Assistant:

void helper_fucomi_ST0_FT0(CPUX86State *env)
{
    int eflags;
    int ret;

    ret = floatx80_compare_quiet(ST0, FT0, &env->fp_status);
    eflags = cpu_cc_compute_all(env, CC_OP);
    eflags = (eflags & ~(CC_Z | CC_P | CC_C)) | fcomi_ccval[ret + 1];
    CC_SRC = eflags;
}